

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O0

void __thiscall
google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
          (ArenaStringPtr *this,string *initial_value)

{
  LogMessage *other;
  string *this_00;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  string *local_18;
  string *initial_value_local;
  ArenaStringPtr *this_local;
  
  local_51 = 0;
  local_18 = initial_value;
  initial_value_local = (string *)this;
  if (initial_value == (string *)0x0) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/arenastring.h"
               ,0x12f);
    local_51 = 1;
    other = LogMessage::operator<<(&local_50,"CHECK failed: initial_value != NULL: ");
    LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    LogMessage::~LogMessage(&local_50);
  }
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this_00,(string *)local_18);
  this->ptr_ = this_00;
  return;
}

Assistant:

GOOGLE_ATTRIBUTE_NOINLINE void CreateInstanceNoArena(const ::std::string* initial_value) {
    GOOGLE_DCHECK(initial_value != NULL);
    ptr_ = new ::std::string(*initial_value);
  }